

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O2

int __thiscall CDELECommand::doWhat(CDELECommand *this,CClient *pClient)

{
  EFTPSTATE EVar1;
  int iVar2;
  FILE *__stream;
  allocator local_39;
  string ret;
  
  EVar1 = CClient::GetClientState(pClient);
  if ((int)EVar1 < 3) {
    std::__cxx11::string::string
              ((string *)&ret,"530 Please login with USER and PASS.\r\n",&local_39);
    CClient::sendMsg(pClient,&ret);
  }
  else {
    CClient::GetUserDir_abi_cxx11_(&ret,pClient);
    chdir(ret._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&ret);
    __stream = fopen((this->super_CCommand).m_Args._M_dataplus._M_p,"rb");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      iVar2 = remove((this->super_CCommand).m_Args._M_dataplus._M_p);
      if (iVar2 == 0) {
        std::__cxx11::string::string
                  ((string *)&ret,"250 Delete operation successful.\r\n",&local_39);
        CClient::sendMsg(pClient,&ret);
        std::__cxx11::string::~string((string *)&ret);
        return 1;
      }
    }
    std::__cxx11::string::string((string *)&ret,"550 Delete operation failed.\r\n",&local_39);
    CClient::sendMsg(pClient,&ret);
  }
  std::__cxx11::string::~string((string *)&ret);
  return -1;
}

Assistant:

int CDELECommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= PASS){
        chdir(pClient->GetUserDir().c_str());
        FILE *file = fopen(m_Args.c_str(),"rb");
        if(file != NULL){
            fclose(file);
            if(0 == remove(m_Args.c_str())){
                string ret = "250 Delete operation successful.\r\n";
                pClient->sendMsg(ret);
                return 1;
            }
        }
        string ret = "550 Delete operation failed.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}